

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

uint8 get8(vorb *z)

{
  uint8 *puVar1;
  long lVar2;
  long in_RDI;
  int8 c;
  uint8 local_11;
  long local_10;
  uint8 local_1;
  
  if (*(long *)(in_RDI + 0x40) == 0) {
    local_10 = in_RDI;
    lVar2 = (**(code **)(*(long *)(in_RDI + 0x30) + 8))
                      (**(undefined8 **)(in_RDI + 0x30),&local_11,1);
    if (lVar2 == 1) {
      local_1 = local_11;
    }
    else {
      *(undefined4 *)(local_10 + 0x98) = 1;
      local_1 = '\0';
    }
  }
  else if (*(ulong *)(in_RDI + 0x40) < *(ulong *)(in_RDI + 0x50)) {
    puVar1 = *(uint8 **)(in_RDI + 0x40);
    *(uint8 **)(in_RDI + 0x40) = puVar1 + 1;
    local_1 = *puVar1;
  }
  else {
    *(undefined4 *)(in_RDI + 0x98) = 1;
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static uint8 get8(vorb *z)
{
   if (USE_MEMORY(z)) {
      if (z->stream >= z->stream_end) { z->eof = TRUE; return 0; }
      return *z->stream++;
   }

   #ifndef STB_VORBIS_NO_STDIO
   {
   /* FAudio change! */
   int8 c;
   if (fread(&c, 1, 1, z->f) != 1) { z->eof = TRUE; return 0; }
   return c;
   }
   #endif
}